

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectFile.cpp
# Opt level: O2

bool __thiscall ObjectFile::deleteAttribute(ObjectFile *this,CK_ATTRIBUTE_TYPE type)

{
  map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
  *this_00;
  mapped_type pOVar1;
  mapped_type *ppOVar2;
  undefined1 uVar3;
  CK_ATTRIBUTE_TYPE type_local;
  MutexLocker lock;
  
  type_local = type;
  if (this->valid == false) {
    uVar3 = 0;
    softHSMLog(7,"deleteAttribute",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/ObjectFile.cpp"
               ,0xf1,"Cannot update invalid object %s",(this->path)._M_dataplus._M_p);
  }
  else {
    MutexLocker::MutexLocker(&lock,this->objectMutex);
    this_00 = &this->attributes;
    ppOVar2 = std::
              map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
              ::operator[](this_00,&type_local);
    pOVar1 = *ppOVar2;
    if (pOVar1 == (mapped_type)0x0) {
      softHSMLog(7,"deleteAttribute",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/ObjectFile.cpp"
                 ,0xfb,"Cannot delete attribute that doesn\'t exist in object %s",
                 (this->path)._M_dataplus._M_p);
    }
    else {
      ppOVar2 = std::
                map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
                ::operator[](this_00,&type_local);
      if (*ppOVar2 != (mapped_type)0x0) {
        (*(*ppOVar2)->_vptr_OSAttribute[1])();
      }
      std::
      _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_OSAttribute_*>,_std::_Select1st<std::pair<const_unsigned_long,_OSAttribute_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
      ::erase(&this_00->_M_t,&type_local);
    }
    MutexLocker::~MutexLocker(&lock);
    if (pOVar1 == (mapped_type)0x0) {
      uVar3 = 0;
    }
    else {
      store(this,false);
      uVar3 = this->valid;
    }
  }
  return (bool)uVar3;
}

Assistant:

bool ObjectFile::deleteAttribute(CK_ATTRIBUTE_TYPE type)
{
	if (!valid)
	{
		DEBUG_MSG("Cannot update invalid object %s", path.c_str());

		return false;
	}

	{
		MutexLocker lock(objectMutex);

		if (attributes[type] == NULL)
		{
			DEBUG_MSG("Cannot delete attribute that doesn't exist in object %s", path.c_str());

			return false;
		}

		delete attributes[type];
		attributes.erase(type);
	}

	store();

	return valid;
}